

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

problem * __thiscall
anon_unknown.dwarf_10a000::preprocessor<baryonyx::problem>::operator()
          (problem *__return_storage_ptr__,preprocessor<baryonyx::problem> *this,int variable_index,
          bool variable_value)

{
  double *pdVar1;
  vector<signed_char,_std::allocator<signed_char>_> *__result;
  double dVar2;
  uint uVar3;
  int iVar4;
  pointer ppVar5;
  problem *ppVar6;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *pvVar7;
  pointer poVar8;
  pointer poVar9;
  context *pcVar10;
  __buckets_ptr pp_Var11;
  pointer pcVar12;
  size_type sVar13;
  pointer pbVar14;
  pointer pbVar15;
  size_t __n;
  pointer piVar16;
  char *pcVar17;
  undefined8 uVar18;
  to_merge_with_objective_function *ptVar19;
  bool bVar20;
  problem_solver_type pVar21;
  pointer poVar22;
  mapped_type *pmVar23;
  size_t sVar24;
  pointer pcVar25;
  pointer pcVar26;
  undefined8 extraout_RAX;
  ulong uVar27;
  value_type __args;
  pointer piVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  pointer poVar32;
  tuple<double,_baryonyx::show_size_type> *mem;
  ulong uVar33;
  affected_variables *__args_1;
  value_type vVar34;
  basic_string_view<char,_std::char_traits<char>_> *__args_00;
  variable_value *__args_01;
  tuple<double,_baryonyx::show_size_type> *mem_00;
  uint uVar35;
  int iVar36;
  pointer poVar37;
  ulong uVar38;
  pointer poVar39;
  double *__args_02;
  pointer in_R8;
  long lVar40;
  int iVar41;
  __hash_code __code;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 in_ZMM2 [64];
  index index_to_affect;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> mapping;
  int i;
  problem *local_2e0;
  affected_variables local_2d8;
  problem *local_2a8;
  undefined1 local_2a0 [24];
  undefined1 local_288 [24];
  vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> vStack_270;
  undefined4 local_250 [2];
  pointer local_248;
  to_merge_with_objective_function *local_240;
  undefined1 local_238 [8];
  value_type vStack_230;
  undefined1 auStack_228 [16];
  pointer piStack_218;
  pointer ppStack_210;
  pointer ppStack_208;
  pointer local_1f8;
  pointer local_1f0;
  pointer local_1e0;
  ios_base local_140 [272];
  
  local_2a8 = (problem *)&this->vars;
  std::
  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_2a8);
  ppVar5 = (this->lifo).data.
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lifo).data.
      super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    (this->lifo).data.
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  ppVar6 = this->pb;
  pcVar26 = (ppVar6->equal_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar25 = (ppVar6->equal_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pcVar26 != pcVar25) {
    piVar28 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      *piVar28 = (int)((ulong)((long)(pcVar26->elements).
                                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pcVar26->elements).
                                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      pcVar26 = pcVar26 + 1;
      piVar28 = piVar28 + 1;
    } while (pcVar26 != pcVar25);
  }
  pcVar26 = (ppVar6->greater_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar25 = (ppVar6->greater_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pcVar26 != pcVar25) {
    piVar28 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      *piVar28 = (int)((ulong)((long)(pcVar26->elements).
                                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pcVar26->elements).
                                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      pcVar26 = pcVar26 + 1;
      piVar28 = piVar28 + 1;
    } while (pcVar26 != pcVar25);
  }
  pcVar26 = (ppVar6->less_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar25 = (ppVar6->less_constraints).
            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pcVar26 != pcVar25) {
    piVar28 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      *piVar28 = (int)((ulong)((long)(pcVar26->elements).
                                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pcVar26->elements).
                                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      pcVar26 = pcVar26 + 1;
      piVar28 = piVar28 + 1;
    } while (pcVar26 != pcVar25);
  }
  if ((-1 < variable_index) &&
     (variable_index <
      (int)((ulong)((long)(this->cache).
                          super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->cache).
                         super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39)) {
    pp_lifo::emplace(&this->lifo,variable_index,variable_value);
    affects(this);
    poVar39 = (this->merge_obj).elements.
              super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->merge_obj).elements.
        super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
        ._M_impl.super__Vector_impl_data._M_finish != poVar39) {
      (this->merge_obj).elements.
      super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
      ._M_impl.super__Vector_impl_data._M_finish = poVar39;
    }
    (this->merge_obj).value = 0.0;
    uVar35 = (int)((ulong)((long)(this->cache).
                                 super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->cache).
                                super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
    if (uVar35 != 0) {
      uVar42 = 0;
      do {
        uVar31 = (this->vars)._M_h._M_bucket_count;
        uVar29 = uVar42 % uVar31;
        pvVar7 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                 (this->vars)._M_h._M_buckets[uVar29];
        pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                           0x0;
        if ((pvVar7 != (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)0x0)
           && (in_R8 = (pvVar7->
                       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                       )._M_impl.super__Vector_impl_data._M_start, pcVar26 = (pointer)pvVar7,
              pcVar25 = in_R8, uVar42 != *(uint *)&(in_R8->label)._M_str)) {
          while (in_R8 = (((_Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            *)&pcVar25->label)->_M_impl).super__Vector_impl_data._M_start,
                in_R8 != (pointer)0x0) {
            uVar3 = *(uint *)&(in_R8->label)._M_str;
            pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                *)0x0;
            if (((ulong)(long)(int)uVar3 % uVar31 != uVar29) ||
               (pcVar26 = pcVar25, pcVar25 = in_R8, uVar42 == uVar3)) goto LAB_00130d9c;
          }
          pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                             0x0;
        }
LAB_00130d9c:
        if (((pcVar26 == (pointer)0x0) ||
            ((((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)pcVar26)->
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>).
             _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)) &&
           (bVar20 = is_unused_variable(this,(int)uVar42), bVar20)) {
          poVar37 = (this->pb->objective).qelements.
                    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = (this->pb->objective).qelements.
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar30 = (long)poVar8 - (long)poVar37 >> 6;
          poVar22 = poVar37;
          if (0 < lVar30) {
            poVar22 = (pointer)((long)&poVar37->factor +
                               ((long)poVar8 - (long)poVar37 & 0xffffffffffffffc0U));
            lVar30 = lVar30 + 1;
            poVar37 = poVar37 + 2;
            do {
              if (uVar42 == (uint)poVar37[-2].variable_index_a) goto LAB_00130e5a;
              if (uVar42 == (uint)poVar37[-2].variable_index_b) goto LAB_00130e5a;
              if (uVar42 == (uint)poVar37[-1].variable_index_a) goto LAB_00131007;
              if (uVar42 == (uint)poVar37[-1].variable_index_b) goto LAB_00131007;
              if (uVar42 == (uint)poVar37->variable_index_a) goto LAB_00130e5e;
              if (uVar42 == (uint)poVar37->variable_index_b) goto LAB_00130e5e;
              if (uVar42 == (uint)poVar37[1].variable_index_a) goto LAB_00131010;
              if (uVar42 == (uint)poVar37[1].variable_index_b) goto LAB_00131010;
              lVar30 = lVar30 + -1;
              poVar37 = poVar37 + 4;
            } while (1 < lVar30);
          }
LAB_00130f8a:
          lVar30 = (long)poVar8 - (long)poVar22 >> 4;
          if (lVar30 != 1) {
            if (lVar30 != 2) {
              poVar37 = poVar8;
              if (((lVar30 != 3) || (poVar37 = poVar22, uVar42 == (uint)poVar22->variable_index_a))
                 || (uVar42 == (uint)poVar22->variable_index_b)) goto LAB_00130e5e;
              poVar22 = poVar22 + 1;
            }
            poVar37 = poVar22;
            if ((uVar42 == (uint)poVar22->variable_index_a) ||
               (uVar42 == (uint)poVar22->variable_index_b)) goto LAB_00130e5e;
            poVar22 = poVar22 + 1;
          }
          poVar37 = poVar8;
          if (uVar42 == (uint)poVar22->variable_index_b) {
            poVar37 = poVar22;
          }
          if (uVar42 == (uint)poVar22->variable_index_a) {
            poVar37 = poVar22;
          }
LAB_00130e5e:
          if (poVar37 == poVar8) goto LAB_00130ff9;
          bVar20 = poVar37->factor < 0.0;
          if (this->pb->type == maximize) {
            bVar20 = 0.0 < poVar37->factor;
          }
          if (bVar20) {
            if (poVar37->variable_index_a == poVar37->variable_index_b) {
              (this->merge_obj).value = poVar37->factor * 0.5 + (this->merge_obj).value;
            }
            else {
              local_2d8.names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_2d8.names.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (&poVar37->variable_index_a)
                                     [uVar42 == (uint)poVar37->variable_index_a]);
              local_238 = (undefined1  [8])(poVar37->factor * 0.5);
              std::
              vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
              ::emplace_back<double,int_const&>
                        ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                          *)&this->merge_obj,(double *)local_238,(int *)&local_2d8);
            }
          }
          poVar22 = poVar37 + 1;
          lVar30 = (long)poVar8 - (long)poVar22 >> 6;
          if (0 < lVar30) {
            poVar22 = (pointer)((long)&poVar22->factor +
                               ((long)poVar8 - (long)poVar22 & 0xffffffffffffffc0U));
            lVar30 = lVar30 + 1;
            poVar37 = poVar37 + 3;
            while ((uVar42 != (uint)poVar37[-2].variable_index_a &&
                   (uVar42 != (uint)poVar37[-2].variable_index_b))) {
              if ((uVar42 == (uint)poVar37[-1].variable_index_a) ||
                 (uVar42 == (uint)poVar37[-1].variable_index_b)) goto LAB_00131007;
              if ((uVar42 == (uint)poVar37->variable_index_a) ||
                 (uVar42 == (uint)poVar37->variable_index_b)) goto LAB_00130e5e;
              if ((uVar42 == (uint)poVar37[1].variable_index_a) ||
                 (uVar42 == (uint)poVar37[1].variable_index_b)) goto LAB_00131010;
              lVar30 = lVar30 + -1;
              poVar37 = poVar37 + 4;
              if (lVar30 < 2) goto LAB_00130f8a;
            }
LAB_00130e5a:
            poVar37 = poVar37 + -2;
            goto LAB_00130e5e;
          }
          goto LAB_00130f8a;
        }
LAB_00130ff9:
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar35);
    }
    auVar43 = in_ZMM2._0_16_;
    local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
    iVar36 = (int)((ulong)((long)(this->cache).
                                 super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->cache).
                                super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
    if (iVar36 != 0) {
      iVar41 = 0;
      do {
        uVar42 = (this->vars)._M_h._M_bucket_count;
        uVar31 = (ulong)(long)iVar41 % uVar42;
        pvVar7 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                 (this->vars)._M_h._M_buckets[uVar31];
        pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                           0x0;
        if ((pvVar7 != (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)0x0)
           && (in_R8 = (pvVar7->
                       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                       )._M_impl.super__Vector_impl_data._M_start, pcVar26 = (pointer)pvVar7,
              pcVar25 = in_R8, iVar41 != *(int *)&(in_R8->label)._M_str)) {
          while (in_R8 = (((_Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            *)&pcVar25->label)->_M_impl).super__Vector_impl_data._M_start,
                in_R8 != (pointer)0x0) {
            iVar4 = *(int *)&(in_R8->label)._M_str;
            pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                *)0x0;
            if (((ulong)(long)iVar4 % uVar42 != uVar31) ||
               (pcVar26 = pcVar25, pcVar25 = in_R8, iVar41 == iVar4)) goto LAB_001310a9;
          }
          pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                             0x0;
        }
LAB_001310a9:
        if (((pcVar26 == (pointer)0x0) ||
            ((((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)pcVar26)->
             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>).
             _M_impl.super__Vector_impl_data._M_start == (pointer)0x0)) &&
           (bVar20 = is_unused_variable(this,iVar41), bVar20)) {
          ppVar6 = this->pb;
          poVar39 = (ppVar6->objective).elements.
                    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar9 = (ppVar6->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          in_R8 = (pointer)((long)poVar9 - (long)poVar39 >> 6);
          poVar32 = poVar39;
          if (0 < (long)in_R8) {
            poVar32 = (pointer)((long)&poVar39->factor +
                               ((long)poVar9 - (long)poVar39 & 0xffffffffffffffc0U));
            in_R8 = (pointer)((long)&(((_Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                        *)&in_R8->label)->_M_impl).super__Vector_impl_data._M_start
                             + 1);
            poVar39 = poVar39 + 2;
            do {
              if (poVar39[-2].variable_index == iVar41) {
                poVar39 = poVar39 + -2;
                goto LAB_00131172;
              }
              if (poVar39[-1].variable_index == iVar41) {
                poVar39 = poVar39 + -1;
                goto LAB_00131172;
              }
              if (poVar39->variable_index == iVar41) goto LAB_00131172;
              if (poVar39[1].variable_index == iVar41) {
                poVar39 = poVar39 + 1;
                goto LAB_00131172;
              }
              in_R8 = (pointer)((long)&in_R8[-1].id + 3);
              poVar39 = poVar39 + 4;
            } while (1 < (long)in_R8);
          }
          lVar30 = (long)poVar9 - (long)poVar32 >> 4;
          if (lVar30 == 1) {
LAB_00131155:
            poVar39 = poVar32;
            if (poVar32->variable_index != iVar41) {
              poVar39 = poVar9;
            }
          }
          else if (lVar30 == 2) {
LAB_0013114b:
            poVar39 = poVar32;
            if (poVar32->variable_index != iVar41) {
              poVar32 = poVar32 + 1;
              goto LAB_00131155;
            }
          }
          else {
            poVar39 = poVar9;
            if ((lVar30 == 3) && (poVar39 = poVar32, poVar32->variable_index != iVar41)) {
              poVar32 = poVar32 + 1;
              goto LAB_0013114b;
            }
          }
LAB_00131172:
          if (poVar39 == poVar9) {
            bVar20 = true;
          }
          else {
            dVar2 = poVar39->factor;
            if (ppVar6->type == maximize) {
              bVar20 = dVar2 < 0.0;
            }
            else {
              bVar20 = 0.0 < dVar2;
            }
            bVar20 = !bVar20 && dVar2 != 0.0;
          }
          pmVar23 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_2a8,(key_type *)local_238);
          *pmVar23 = bVar20;
        }
        auVar43 = in_ZMM2._0_16_;
        iVar41 = local_238._0_4_ + 1;
        local_238._0_4_ = iVar41;
      } while (iVar41 != iVar36);
    }
    local_240 = &this->merge_obj;
    affects(this);
    pcVar10 = this->ctx;
    local_2d8.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(this->vars)._M_h._M_element_count;
    sVar24 = baryonyx::memory_consumed(this->pb);
    auVar43 = vcvtusi2sd_avx512f(auVar43,sVar24);
    local_248 = auVar43._0_8_;
    piVar28 = (pointer)((double)local_248 * 0.0009765625);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = piVar28;
    piVar16 = (pointer)((double)piVar28 * 0.0009765625);
    if ((double)piVar16 * 0.0009765625 <= 0.5) {
      if ((double)piVar16 <= 0.5) {
        if ((double)piVar28 <= 0.5) {
          local_250[0] = 3;
        }
        else {
          local_250[0] = 2;
          local_248 = piVar28;
        }
      }
      else {
        local_250[0] = 1;
        local_248 = piVar16;
      }
    }
    else {
      local_250[0] = 0;
      local_248 = (pointer)((double)piVar16 * 0.0009765625);
    }
    baryonyx::to_string_abi_cxx11_((string *)local_238,(baryonyx *)local_250,mem);
    baryonyx::info<unsigned_long,std::__cxx11::string>
              (pcVar10,"  - Preprocessor finish. Removed variables {} (size: {})\n",
               (unsigned_long *)&local_2d8,(string *)local_238);
    if (local_238 != (undefined1  [8])((long)local_238 + 0x10)) {
      operator_delete((void *)local_238,auStack_228._0_8_ + 1);
    }
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->type = maximize;
    __return_storage_ptr__->problem_type = equalities_01;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vars).values.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).value = 0.0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->equal_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->greater_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->less_constraints).
    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).elements.
    super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->objective).qelements.
    super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppVar6 = this->pb;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ppVar6->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    auVar44 = ZEXT1664(auVar43);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(ppVar6->strings).
                super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    ppVar6 = this->pb;
    __return_storage_ptr__->type = ppVar6->type;
    local_238._0_5_ = 0xffffffff;
    std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)local_2a0,
               ((long)(ppVar6->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(ppVar6->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type *)local_238,(allocator_type *)&local_2d8);
    local_2a8 = this->pb;
    uVar42 = ((long)(local_2a8->vars).values.
                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_2a8->vars).values.
                    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    iVar36 = (int)uVar42;
    if (iVar36 == 0) {
      iVar41 = 0;
    }
    else {
      pp_Var11 = (this->vars)._M_h._M_buckets;
      uVar31 = (this->vars)._M_h._M_bucket_count;
      uVar27 = 0;
      uVar29 = 0;
      do {
        uVar33 = uVar27 % uVar31;
        pcVar26 = (pointer)pp_Var11[uVar33];
        pcVar25 = (pointer)0x0;
        if ((pcVar26 != (pointer)0x0) &&
           (pcVar12 = (((_Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *
                        )&pcVar26->label)->_M_impl).super__Vector_impl_data._M_start,
           pcVar25 = pcVar26, uVar27 != *(uint *)&(pcVar12->label)._M_str)) {
          while (in_R8 = pcVar12, pcVar12 = (pointer)(in_R8->label)._M_len, pcVar12 != (pointer)0x0)
          {
            uVar35 = *(uint *)&(pcVar12->label)._M_str;
            pcVar25 = (pointer)0x0;
            if (((ulong)(long)(int)uVar35 % uVar31 != uVar33) || (pcVar25 = in_R8, uVar27 == uVar35)
               ) goto LAB_001313ef;
          }
          pcVar25 = (pointer)0x0;
        }
LAB_001313ef:
        if (pcVar25 == (pointer)0x0) {
          pcVar26 = (pointer)0x0;
        }
        else {
          pcVar26 = (((_Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                     &pcVar25->label)->_M_impl).super__Vector_impl_data._M_start;
        }
        if (pcVar26 == (pointer)0x0) {
          uVar38 = (ulong)((int)uVar29 + 1);
          uVar33 = uVar29;
        }
        else {
          uVar33 = (ulong)(byte)*(undefined1 *)((long)&(pcVar26->label)._M_str + 4) << 0x20 |
                   0xffffffff;
          uVar38 = uVar29;
        }
        iVar41 = (int)uVar38;
        *(int *)(&((solver_parameters *)local_2a0._0_8_)->time_limit + uVar27) = (int)uVar33;
        *(char *)((long)&((solver_parameters *)local_2a0._0_8_)->time_limit + uVar27 * 8 + 4) =
             (char)(uVar33 >> 0x20);
        uVar27 = uVar27 + 1;
        uVar29 = uVar38;
      } while (uVar27 != (uVar42 & 0xffffffff));
    }
    local_2e0 = __return_storage_ptr__;
    if (iVar41 != iVar36 - (int)(this->vars)._M_h._M_element_count) goto LAB_00131d3a;
    piStack_218 = (pointer)0x0;
    ppStack_210 = (pointer)0x0;
    local_238._0_4_ = 0;
    local_238[4] = false;
    local_238._5_3_ = 0;
    vStack_230.first = 0;
    vStack_230.second = false;
    vStack_230._5_3_ = 0;
    auStack_228._0_8_ = 0;
    auStack_228._8_8_ = (void *)0x0;
    ppStack_208 = (pointer)((local_2a8->objective).value + (this->merge_obj).value);
    uVar42 = (long)(local_2a8->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_2a8->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar42 & 0xffffffff0) != 0) {
      uVar42 = uVar42 >> 4 & 0xffffffff;
      lVar30 = 0;
      do {
        poVar39 = (this->pb->objective).elements.
                  super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __args_02 = (double *)((long)&poVar39->factor + lVar30);
        pdVar1 = &((solver_parameters *)local_2a0._0_8_)->time_limit +
                 *(int *)((long)&poVar39->variable_index + lVar30);
        if (*(int *)pdVar1 == -1) {
          if (*(bool *)((long)pdVar1 + 4) == true) {
            ppStack_208 = (pointer)(*__args_02 + (double)ppStack_208);
          }
        }
        else {
          auVar44 = ZEXT1664(auVar44._0_16_);
          std::
          vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
          ::emplace_back<double_const&,int_const&>
                    ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                      *)local_238,__args_02,(int *)pdVar1);
        }
        lVar30 = lVar30 + 0x10;
        uVar42 = uVar42 - 1;
      } while (uVar42 != 0);
    }
    uVar42 = (long)(this->pb->objective).qelements.
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->pb->objective).qelements.
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar42 & 0xffffffff0) != 0) {
      uVar42 = uVar42 >> 4 & 0xffffffff;
      lVar30 = 0;
      do {
        poVar22 = (this->pb->objective).qelements.
                  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&poVar22->factor + lVar30);
        local_2d8.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(&((solver_parameters *)local_2a0._0_8_)->time_limit)
                      [*(int *)((long)&poVar22->variable_index_a + lVar30)];
        local_288._0_8_ =
             (&((solver_parameters *)local_2a0._0_8_)->time_limit)
             [*(int *)((long)&poVar22->variable_index_b + lVar30)];
        if ((int)local_2d8.names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == -1) {
          __args_1 = (affected_variables *)local_288;
          if ((int)local_288._0_8_ != -1) goto LAB_00131575;
          local_2d8.names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_1_ =
               (char)((ulong)local_2d8.names.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x20);
          bVar20 = local_2d8.names.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_1_ == '\x01';
          if ((bVar20) &&
             (local_288[4] = (char)((ulong)local_288._0_8_ >> 0x20), bVar20 = local_288[4] == '\x01'
             , bVar20)) {
            ppStack_208 = (pointer)(*pdVar1 + (double)ppStack_208);
          }
        }
        else {
          __args_1 = &local_2d8;
          if ((int)local_288._0_8_ == -1) {
LAB_00131575:
            auVar44 = ZEXT1664(auVar44._0_16_);
            std::
            vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
            ::emplace_back<double_const&,int&>
                      ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                        *)local_238,pdVar1,(int *)__args_1);
          }
          else {
            auVar44 = ZEXT1664(auVar44._0_16_);
            std::
            vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
            ::emplace_back<double_const&,int&,int&>
                      ((vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
                        *)(auStack_228 + 8),pdVar1,(int *)&local_2d8,(int *)local_288);
          }
        }
        lVar30 = lVar30 + 0x10;
        uVar42 = uVar42 - 1;
      } while (uVar42 != 0);
    }
    ptVar19 = local_240;
    auVar43 = auVar44._0_16_;
    uVar42 = (long)(this->merge_obj).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->merge_obj).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar42 & 0xffffffff0) != 0) {
      uVar31 = 0;
      do {
        lVar30 = (long)vStack_230 - (long)local_238 >> 6;
        vVar34 = (value_type)local_238;
        if (0 < lVar30) {
          vVar34 = (value_type)
                   (((long)vStack_230 - (long)local_238 & 0xffffffffffffffc0U) + (long)local_238);
          lVar30 = lVar30 + 1;
          __args = (value_type)((long)local_238 + 0x20);
          do {
            if (uVar31 == *(uint *)((long)__args + -0x18)) {
              __args = (value_type)((long)__args + -0x20);
              goto LAB_001316a8;
            }
            if (uVar31 == *(uint *)((long)__args + -8)) {
              __args = (value_type)((long)__args + -0x10);
              goto LAB_001316a8;
            }
            if (uVar31 == *(uint *)((long)__args + 8)) goto LAB_001316a8;
            if (uVar31 == *(uint *)((long)__args + 0x18)) {
              __args = (value_type)((long)__args + 0x10);
              goto LAB_001316a8;
            }
            lVar30 = lVar30 + -1;
            __args = (value_type)((long)__args + 0x40);
          } while (1 < lVar30);
        }
        lVar30 = (long)vStack_230 - (long)vVar34 >> 4;
        if (lVar30 == 1) {
LAB_00131689:
          __args = vVar34;
          if (uVar31 != *(uint *)((long)vVar34 + 8)) {
            __args = vStack_230;
          }
        }
        else if (lVar30 == 2) {
LAB_0013167d:
          __args = vVar34;
          if (uVar31 != *(uint *)((long)vVar34 + 8)) {
            vVar34 = (value_type)((long)vVar34 + 0x10);
            goto LAB_00131689;
          }
        }
        else {
          __args = vStack_230;
          if ((lVar30 == 3) && (__args = vVar34, uVar31 != *(uint *)((long)vVar34 + 8))) {
            vVar34 = (value_type)((long)vVar34 + 0x10);
            goto LAB_0013167d;
          }
        }
LAB_001316a8:
        if (__args == vStack_230) {
          auVar44 = ZEXT1664(auVar44._0_16_);
          std::
          vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
          ::emplace_back<double&,int&>
                    ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                      *)local_238,(double *)__args,(int *)((long)__args + 8));
        }
        else {
          *(double *)__args =
               (ptVar19->elements).
               super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar31].factor + *(double *)__args;
        }
        auVar43 = auVar44._0_16_;
        uVar31 = uVar31 + 1;
      } while (uVar31 != (uVar42 >> 4 & 0xffffffff));
    }
    std::
    vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
    ::_M_move_assign(&(__return_storage_ptr__->objective).elements,local_238);
    std::
    vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
    ::_M_move_assign(&(__return_storage_ptr__->objective).qelements,auStack_228 + 8);
    (__return_storage_ptr__->objective).value = (double)ppStack_208;
    if ((void *)auStack_228._8_8_ != (void *)0x0) {
      operator_delete((void *)auStack_228._8_8_,(long)ppStack_210 - auStack_228._8_8_);
    }
    if ((value_type)local_238 != (value_type)0x0) {
      operator_delete((void *)local_238,auStack_228._0_8_ - (long)local_238);
    }
    ppVar6 = this->pb;
    sVar13 = (this->vars)._M_h._M_element_count;
    local_2d8.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d8.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    local_2d8.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    local_2d8.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::reserve(&local_2d8.names,
              ((long)(ppVar6->affected_vars).names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(ppVar6->affected_vars).names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar13);
    __result = &local_2d8.values;
    std::vector<signed_char,_std::allocator<signed_char>_>::reserve
              (__result,(size_type)
                        ((ppVar6->affected_vars).values.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                        (sVar13 - (long)(ppVar6->affected_vars).values.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start)));
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::basic_string_view<char,std::char_traits<char>>const*,std::back_insert_iterator<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
              ((ppVar6->affected_vars).names.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (ppVar6->affected_vars).names.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_2d8.names);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<signed_char_const*,std::back_insert_iterator<std::vector<signed_char,std::allocator<signed_char>>>>
              ((ppVar6->affected_vars).values.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (ppVar6->affected_vars).values.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<signed_char,_std::allocator<signed_char>_>_>)
               __result);
    vStack_270.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_finish = (variable_value *)0x0;
    vStack_270.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (variable_value *)0x0;
    local_288._0_8_ = (pointer)0x0;
    local_288._8_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    local_288._16_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    vStack_270.
    super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auVar44 = ZEXT1664(auVar43);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::reserve((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_288,
              ((long)(this->pb->vars).names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->pb->vars).names.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) -
              (this->vars)._M_h._M_element_count);
    std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::reserve
              (&vStack_270,
               ((long)(this->pb->vars).names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->pb->vars).names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) -
               (this->vars)._M_h._M_element_count);
    lVar30 = (long)(this->pb->vars).values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->pb->vars).values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar30 != 0) {
      lVar40 = 0;
      do {
        iVar36 = (int)lVar40;
        uVar42 = (this->vars)._M_h._M_bucket_count;
        uVar31 = (ulong)(long)iVar36 % uVar42;
        pvVar7 = (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                 (this->vars)._M_h._M_buckets[uVar31];
        pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                           0x0;
        if ((pvVar7 != (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)0x0)
           && (in_R8 = (pvVar7->
                       super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                       )._M_impl.super__Vector_impl_data._M_start, pcVar26 = (pointer)pvVar7,
              pcVar25 = in_R8, *(int *)&(in_R8->label)._M_str != iVar36)) {
          while (in_R8 = (((_Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            *)&pcVar25->label)->_M_impl).super__Vector_impl_data._M_start,
                in_R8 != (pointer)0x0) {
            iVar41 = *(int *)&(in_R8->label)._M_str;
            pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                                *)0x0;
            if (((ulong)(long)iVar41 % uVar42 != uVar31) ||
               (pcVar26 = pcVar25, pcVar25 = in_R8, iVar41 == iVar36)) goto LAB_001318c0;
          }
          pcVar26 = (pointer)(vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                             0x0;
        }
LAB_001318c0:
        if (pcVar26 == (pointer)0x0) {
          pcVar26 = (pointer)0x0;
        }
        else {
          pcVar26 = (((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)pcVar26
                     )->
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        __args_00 = (this->pb->vars).names.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar40;
        if (pcVar26 == (pointer)0x0) {
          if (local_288._8_8_ == local_288._16_8_) {
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)local_288,(iterator)local_288._8_8_,__args_00);
          }
          else {
            pcVar17 = __args_00->_M_str;
            *(size_t *)local_288._8_8_ = __args_00->_M_len;
            *(char **)(local_288._8_8_ + 8) = pcVar17;
            local_288._8_8_ = local_288._8_8_ + 0x10;
          }
          __args_01 = (this->pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar40;
          if (vStack_270.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_270.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
            _M_realloc_insert<baryonyx::variable_value_const&>
                      ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>> *)
                       &vStack_270,
                       (iterator)
                       vStack_270.
                       super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__args_01);
          }
          else {
            (vStack_270.
             super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
             ._M_impl.super__Vector_impl_data._M_finish)->type = __args_01->type;
            iVar36 = __args_01->max;
            (vStack_270.
             super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
             ._M_impl.super__Vector_impl_data._M_finish)->min = __args_01->min;
            (vStack_270.
             super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
             ._M_impl.super__Vector_impl_data._M_finish)->max = iVar36;
            vStack_270.
            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 vStack_270.
                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          if (local_2d8.names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_2d8.names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)&local_2d8,
                       (iterator)
                       local_2d8.names.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__args_00);
          }
          else {
            pcVar17 = __args_00->_M_str;
            (local_2d8.names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_len = __args_00->_M_len;
            (local_2d8.names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_str = pcVar17;
            local_2d8.names.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_2d8.names.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          std::vector<signed_char,std::allocator<signed_char>>::emplace_back<bool_const&>
                    ((vector<signed_char,std::allocator<signed_char>> *)__result,
                     (bool *)((long)&(pcVar26->label)._M_str + 4));
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != (lVar30 >> 2) * -0x5555555555555555);
    }
    std::_Tuple_impl<0ul,baryonyx::variables,baryonyx::affected_variables>::
    _Tuple_impl<baryonyx::variables&,baryonyx::affected_variables&,void>
              ((_Tuple_impl<0ul,baryonyx::variables,baryonyx::affected_variables> *)local_238,
               (variables *)local_288,&local_2d8);
    if (vStack_270.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_270.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_270.
                            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_270.
                            super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_288._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ - local_288._0_8_);
    }
    if (local_2d8.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2d8.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d8.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2d8.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2d8.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d8.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_2d8.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&__return_storage_ptr__->affected_vars;
    local_2d8.names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&__return_storage_ptr__->vars;
    std::_Tuple_impl<0ul,baryonyx::variables&,baryonyx::affected_variables&>::
    _M_assign<baryonyx::variables,baryonyx::affected_variables>
              ((_Tuple_impl<0ul,baryonyx::variables&,baryonyx::affected_variables&> *)&local_2d8,
               (_Tuple_impl<0UL,_baryonyx::variables,_baryonyx::affected_variables> *)local_238);
    if (local_1f0 != (pointer)0x0) {
      operator_delete(local_1f0,(long)local_1e0 - (long)local_1f0);
    }
    if (ppStack_208 != (pointer)0x0) {
      operator_delete(ppStack_208,(long)local_1f8 - (long)ppStack_208);
    }
    if ((void *)auStack_228._8_8_ != (void *)0x0) {
      operator_delete((void *)auStack_228._8_8_,(long)ppStack_210 - auStack_228._8_8_);
    }
    if ((value_type)local_238 != (value_type)0x0) {
      operator_delete((void *)local_238,auStack_228._0_8_ - (long)local_238);
    }
    uVar18 = local_2a0._0_8_;
    auVar43 = auVar44._0_16_;
    ppVar6 = this->pb;
    uVar35 = (int)((ulong)((long)(ppVar6->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(ppVar6->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    if (uVar35 != 0) {
      pbVar14 = (__return_storage_ptr__->vars).names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar30 = 0;
      do {
        lVar40 = (long)*(int *)((long)&((solver_parameters *)uVar18)->time_limit + lVar30);
        if (-1 < lVar40) {
          pbVar15 = (ppVar6->vars).names.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __n = *(size_t *)((long)&pbVar15->_M_len + lVar30 * 2);
          if ((__n != pbVar14[lVar40]._M_len) ||
             ((__n != 0 &&
              (iVar36 = bcmp(*(void **)((long)&pbVar15->_M_str + lVar30 * 2),pbVar14[lVar40]._M_str,
                             __n), iVar36 != 0)))) {
            (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
            goto LAB_00131d30;
          }
        }
        auVar43 = auVar44._0_16_;
        lVar30 = lVar30 + 8;
      } while ((ulong)uVar35 << 3 != lVar30);
    }
    constraints_exclude_copy
              ((preprocessor<baryonyx::problem> *)local_2a0,
               (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               &this->equal_constraints,
               (vector<int,_std::allocator<int>_> *)&ppVar6->equal_constraints,
               &__return_storage_ptr__->equal_constraints,
               (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)in_R8);
    constraints_exclude_copy
              ((preprocessor<baryonyx::problem> *)local_2a0,
               (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               &this->greater_constraints,
               (vector<int,_std::allocator<int>_> *)&this->pb->greater_constraints,
               &__return_storage_ptr__->greater_constraints,
               (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)in_R8);
    constraints_exclude_copy
              ((preprocessor<baryonyx::problem> *)local_2a0,
               (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               &this->less_constraints,
               (vector<int,_std::allocator<int>_> *)&this->pb->less_constraints,
               &__return_storage_ptr__->less_constraints,
               (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)in_R8);
    iVar36 = (int)((ulong)((long)(__return_storage_ptr__->vars).values.
                                 super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->vars).values.
                                super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    bVar20 = is_valid_variable_index(&__return_storage_ptr__->equal_constraints,iVar36);
    if (((bVar20) &&
        (bVar20 = is_valid_variable_index(&__return_storage_ptr__->greater_constraints,iVar36),
        bVar20)) &&
       (bVar20 = is_valid_variable_index(&__return_storage_ptr__->less_constraints,iVar36), bVar20))
    {
      pVar21 = baryonyx::problem::which_problem_type(__return_storage_ptr__);
      __return_storage_ptr__->problem_type = pVar21;
      pcVar10 = this->ctx;
      sVar24 = baryonyx::memory_consumed(__return_storage_ptr__);
      auVar43 = vcvtusi2sd_avx512f(auVar43,sVar24);
      local_2d8.names.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = auVar43._0_8_;
      pbVar14 = (pointer)((double)local_2d8.names.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish * 0.0009765625);
      pbVar15 = (pointer)((double)pbVar14 * 0.0009765625);
      if ((double)pbVar15 * 0.0009765625 <= 0.5) {
        if ((double)pbVar15 <= 0.5) {
          if ((double)pbVar14 <= 0.5) {
            local_2d8.names.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_2d8.names.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
          }
          else {
            local_2d8.names.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_2d8.names.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
            local_2d8.names.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
          }
        }
        else {
          local_2d8.names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_2d8.names.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
          local_2d8.names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar15;
        }
      }
      else {
        local_2d8.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_2d8.names.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
        local_2d8.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((double)pbVar15 * 0.0009765625);
      }
      baryonyx::to_string_abi_cxx11_((string *)local_238,(baryonyx *)&local_2d8,mem_00);
      baryonyx::info<std::__cxx11::string>
                (pcVar10,"- Preprocessing finishes (size: {})\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
      if (local_238 != (undefined1  [8])((long)local_238 + 0x10)) {
        operator_delete((void *)local_238,auStack_228._0_8_ + 1);
      }
      std::ofstream::ofstream(local_238,"preprocessed.lp",_S_out);
      baryonyx::operator<<((ostream *)local_238,__return_storage_ptr__);
      local_238._0_4_ = _VTT;
      local_238[4] = std::ofstream::VTT_4;
      local_238._5_3_ = uRam000000000072c185;
      *(undefined8 *)(local_238 + *(long *)((long)_VTT + -0x18)) = _log;
      std::filebuf::~filebuf((filebuf *)(local_238 + 8));
      std::ios_base::~ios_base(local_140);
      if ((context *)local_2a0._0_8_ != (context *)0x0) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ - local_2a0._0_8_);
      }
      return __return_storage_ptr__;
    }
LAB_00131d30:
    (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
  }
  (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
LAB_00131d3a:
  (anonymous_namespace)::preprocessor<baryonyx::problem>::operator()();
  std::ofstream::~ofstream(local_238);
  if ((context *)local_2a0._0_8_ != (context *)0x0) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ - local_2a0._0_8_);
  }
  baryonyx::problem::~problem(local_2e0);
  _Unwind_Resume(extraout_RAX);
LAB_00131007:
  poVar37 = poVar37 + -1;
  goto LAB_00130e5e;
LAB_00131010:
  poVar37 = poVar37 + 1;
  goto LAB_00130e5e;
}

Assistant:

bx::problem operator()(int variable_index, bool variable_value)
    {
        vars.clear();
        lifo.clear();
        init_constraints_length_container();

        affect_variable(variable_index, variable_value);
        affects();

        make_lp_from_bqp_objective();
        try_remove_unused_variable();
        affects();

        info(ctx,
             "  - Preprocessor finish. Removed variables {} (size: {})\n",
             vars.size(),
             to_string(bx::memory_consumed_size(memory_consumed(pb))));

        return make_problem();
    }